

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

int __thiscall deqp::gles31::bb::BufferLayout::getVariableIndex(BufferLayout *this,string *name)

{
  pointer pBVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  size_type *psVar6;
  
  pBVar1 = (this->bufferVars).
           super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (int)((long)(this->bufferVars).
                      super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) * 0x38e38e39;
  if (0 < (int)uVar5) {
    __s2 = (name->_M_dataplus)._M_p;
    sVar2 = name->_M_string_length;
    psVar6 = &(pBVar1->name)._M_string_length;
    uVar4 = 0;
    do {
      __n = *psVar6;
      if ((__n == sVar2) &&
         ((__n == 0 ||
          (iVar3 = bcmp((((string *)(psVar6 + -1))->_M_dataplus)._M_p,__s2,__n), iVar3 == 0)))) {
        return (int)uVar4;
      }
      uVar4 = uVar4 + 1;
      psVar6 = psVar6 + 9;
    } while ((uVar5 & 0x7fffffff) != uVar4);
  }
  return -1;
}

Assistant:

int BufferLayout::getVariableIndex (const string& name) const
{
	for (int ndx = 0; ndx < (int)bufferVars.size(); ndx++)
	{
		if (bufferVars[ndx].name == name)
			return ndx;
	}
	return -1;
}